

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O1

int fe_free(fe_t *fe)

{
  int iVar1;
  mfcc_t **arr;
  int iVar2;
  
  iVar2 = 0;
  if (fe != (fe_t *)0x0) {
    iVar1 = fe->refcount;
    iVar2 = iVar1 + -1;
    fe->refcount = iVar2;
    if (iVar1 < 2) {
      if (fe->mel_fb != (melfb_t *)0x0) {
        arr = fe->mel_fb->mel_cosine;
        if (arr != (mfcc_t **)0x0) {
          fe_free_2d(arr);
        }
        ckd_free(fe->mel_fb->lifter);
        ckd_free(fe->mel_fb->spec_start);
        ckd_free(fe->mel_fb->filt_start);
        ckd_free(fe->mel_fb->filt_width);
        ckd_free(fe->mel_fb->filt_coeffs);
        ckd_free(fe->mel_fb);
      }
      ckd_free(fe->spch);
      ckd_free(fe->frame);
      ckd_free(fe->ccc);
      ckd_free(fe->sss);
      ckd_free(fe->spec);
      ckd_free(fe->mfspec);
      ckd_free(fe->overflow_samps);
      ckd_free(fe->hamming_window);
      if (fe->noise_stats != (noise_stats_t *)0x0) {
        fe_free_noisestats(fe->noise_stats);
      }
      if (fe->vad_data != (vad_data_t *)0x0) {
        fe_prespch_free(fe->vad_data->prespch_buf);
        ckd_free(fe->vad_data);
      }
      cmd_ln_free_r(fe->config);
      ckd_free(fe);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
fe_free(fe_t * fe)
{
    if (fe == NULL)
        return 0;
    if (--fe->refcount > 0)
        return fe->refcount;

    /* kill FE instance - free everything... */
    if (fe->mel_fb) {
        if (fe->mel_fb->mel_cosine)
            fe_free_2d((void *) fe->mel_fb->mel_cosine);
        ckd_free(fe->mel_fb->lifter);
        ckd_free(fe->mel_fb->spec_start);
        ckd_free(fe->mel_fb->filt_start);
        ckd_free(fe->mel_fb->filt_width);
        ckd_free(fe->mel_fb->filt_coeffs);
        ckd_free(fe->mel_fb);
    }
    ckd_free(fe->spch);
    ckd_free(fe->frame);
    ckd_free(fe->ccc);
    ckd_free(fe->sss);
    ckd_free(fe->spec);
    ckd_free(fe->mfspec);
    ckd_free(fe->overflow_samps);
    ckd_free(fe->hamming_window);

    if (fe->noise_stats)
        fe_free_noisestats(fe->noise_stats);

    if (fe->vad_data) {
        fe_prespch_free(fe->vad_data->prespch_buf);
	ckd_free(fe->vad_data);
    }

    cmd_ln_free_r(fe->config);
    ckd_free(fe);

    return 0;
}